

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O0

void compute_global_motion_for_references
               (AV1_COMP *cpi,YV12_BUFFER_CONFIG **ref_buf,FrameDistPair *reference_frame,
               int num_ref_frames,MotionModel *motion_models,uint8_t *segment_map,int segment_map_w,
               int segment_map_h)

{
  char cVar1;
  int in_ECX;
  long in_RDX;
  YV12_BUFFER_CONFIG **in_RSI;
  aom_internal_error_info *in_RDI;
  uint8_t *in_R8;
  AV1_COMP *unaff_retaddr;
  int ref_frame;
  int frame;
  aom_internal_error_info *error_info;
  AV1_COMMON *cm;
  int local_44;
  undefined4 in_stack_ffffffffffffffe0;
  aom_internal_error_info *error_info_00;
  
  local_44 = 0;
  error_info_00 = in_RDI;
  while( true ) {
    if (in_ECX <= local_44) {
      return;
    }
    cVar1 = *(char *)(in_RDX + 4 + (long)local_44 * 8);
    av1_compute_gm_for_valid_ref_frames
              (unaff_retaddr,error_info_00,in_RSI,(int)((ulong)in_RDX >> 0x20),
               (MotionModel *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,ref_frame,
               (int)error_info);
    if ((*(int *)((long)error_info_00[0x3b6].jmp[0].__saved_mask.__val + 0x54) != 0) &&
       ((byte)in_RDI[0x289].detail[(long)(int)cVar1 * 0x24 + 0x5c] < 2)) break;
    local_44 = local_44 + 1;
  }
  return;
}

Assistant:

static inline void compute_global_motion_for_references(
    AV1_COMP *cpi, YV12_BUFFER_CONFIG *ref_buf[REF_FRAMES],
    FrameDistPair reference_frame[REF_FRAMES - 1], int num_ref_frames,
    MotionModel *motion_models, uint8_t *segment_map, const int segment_map_w,
    const int segment_map_h) {
  AV1_COMMON *const cm = &cpi->common;
  struct aom_internal_error_info *const error_info =
      cpi->td.mb.e_mbd.error_info;
  // Compute global motion w.r.t. reference frames starting from the nearest ref
  // frame in a given direction.
  for (int frame = 0; frame < num_ref_frames; frame++) {
    int ref_frame = reference_frame[frame].frame;
    av1_compute_gm_for_valid_ref_frames(cpi, error_info, ref_buf, ref_frame,
                                        motion_models, segment_map,
                                        segment_map_w, segment_map_h);
    // If global motion w.r.t. current ref frame is
    // INVALID/TRANSLATION/IDENTITY, skip the evaluation of global motion w.r.t
    // the remaining ref frames in that direction.
    if (cpi->sf.gm_sf.prune_ref_frame_for_gm_search &&
        cm->global_motion[ref_frame].wmtype <= TRANSLATION)
      break;
  }
}